

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTDiagMap.cpp
# Opt level: O3

Diagnostics * __thiscall
slang::ast::ASTDiagMap::coalesce
          (Diagnostics *__return_storage_ptr__,ASTDiagMap *this,SourceManager *sourceManager)

{
  Diagnostic *pDVar1;
  pointer __x;
  uint uVar2;
  ushort uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  Diagnostic *pDVar7;
  DefinitionSymbol *pDVar8;
  char_pointer puVar9;
  char_pointer puVar10;
  Scope *pSVar11;
  iterator __begin4;
  Diagnostic *rhs;
  char_pointer puVar12;
  Diagnostic *this_00;
  pointer __x_00;
  CheckerInstanceBodySymbol *checkerBody;
  Symbol *pSVar13;
  iterator __end4;
  table_element_pointer ppVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  iterator iVar17;
  string_view arg;
  Diagnostic d;
  InstanceSymbol *local_c0;
  char_pointer local_b8;
  Diagnostic local_b0;
  ulong local_40;
  SourceManager *local_38;
  
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  local_38 = sourceManager;
  iVar17 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
                    *)this);
  if (iVar17.p_ != (table_element_pointer)0x0) {
LAB_0044d96e:
    do {
      ppVar14 = iVar17.p_;
      local_b8 = iVar17.pc_;
      rhs = (ppVar14->second).
            super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
            super__Vector_impl_data._M_start;
      pDVar1 = (ppVar14->second).
               super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ppVar14->first).super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
          super__Tuple_impl<1UL,_slang::SourceLocation>.
          super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl ==
          (SourceLocation)0xffffffffffffffff) {
        for (; rhs != pDVar1; rhs = rhs + 1) {
          SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic&>
                    ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,rhs);
        }
      }
      else {
        if (rhs == pDVar1) {
LAB_0044dba4:
          bVar5 = true;
        }
        else {
          this_00 = (Diagnostic *)0x0;
          local_c0 = (InstanceSymbol *)0x0;
          local_40 = 0;
          do {
            if ((this_00 != (Diagnostic *)0x0) &&
               (bVar5 = Diagnostic::operator==(this_00,rhs), !bVar5)) {
              bVar5 = false;
              goto LAB_0044dbab;
            }
            pSVar13 = rhs->symbol;
            while (pSVar13 != (Symbol *)0x0) {
              if (pSVar13->kind == CheckerInstanceBody) {
                pSVar11 = (Scope *)pSVar13[1].originatingSyntax[1].parent;
                if (((ulong)pSVar13[2].name._M_str & 0x10000000000) == 0) {
                  pDVar7 = Diagnostic::addNote(rhs,(DiagCode)0x540008,
                                               *(SourceLocation *)(pSVar13[1].originatingSyntax + 1)
                                              );
                  arg._M_str = "checker";
                  arg._M_len = 7;
                  pDVar7 = Diagnostic::operator<<(pDVar7,arg);
                  Diagnostic::operator<<(pDVar7,*(string_view *)(*(long *)(pSVar13 + 2) + 8));
                }
              }
              else {
                if (pSVar13->kind == InstanceBody) {
                  local_40 = local_40 + 1;
                  pSVar11 = (((InstanceSymbol *)pSVar13[1].originatingSyntax)->
                            super_InstanceSymbolBase).super_Symbol.parentScope;
                  if ((pSVar11 != (Scope *)0x0) &&
                     ((pSVar11->thisSym->kind | Definition) != CompilationUnit)) {
                    this_00 = rhs;
                    local_c0 = (InstanceSymbol *)pSVar13[1].originatingSyntax;
                  }
                  break;
                }
                pSVar11 = pSVar13->parentScope;
              }
              if (pSVar11 == (Scope *)0x0) break;
              pSVar13 = pSVar11->thisSym;
            }
            rhs = rhs + 1;
          } while (rhs != pDVar1);
          if (this_00 == (Diagnostic *)0x0) goto LAB_0044dba4;
          pDVar8 = InstanceSymbol::getDefinition(local_c0);
          uVar4 = local_40;
          bVar5 = true;
          if (local_40 < pDVar8->instanceCount) {
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::vector(&local_b0.args,&this_00->args);
            std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
                      (&local_b0.ranges,&this_00->ranges);
            std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
                      (&local_b0.notes,&this_00->notes);
            local_b0.code = this_00->code;
            local_b0._92_4_ = *(undefined4 *)&this_00->field_0x5c;
            local_b0.location = this_00->location;
            local_b0.symbol = (Symbol *)local_c0;
            local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar4;
            local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._9_7_ =
                 SUB87((ulong)*(undefined8 *)
                               &(this_00->coalesceCount).
                                super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                super__Optional_payload_base<unsigned_long>._M_engaged >> 8,0);
            local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged = true;
            SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                      ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&local_b0);
            std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector
                      (&local_b0.notes);
            if (local_b0.ranges.
                super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.ranges.
                              super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.ranges.
                                    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.ranges.
                                    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::~vector(&local_b0.args);
            goto LAB_0044db5a;
          }
        }
LAB_0044dbab:
        __x = (ppVar14->second).
              super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
              super__Vector_impl_data._M_start;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::vector(&local_b0.args,&__x->args);
        std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
                  (&local_b0.ranges,&__x->ranges);
        std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
                  (&local_b0.notes,&__x->notes);
        local_b0.symbol = __x->symbol;
        local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload =
             (__x->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged =
             (__x->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
        local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._9_7_ =
             *(undefined7 *)
              &(__x->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>.field_0x9;
        local_b0.code = __x->code;
        local_b0._92_4_ = *(undefined4 *)&__x->field_0x5c;
        local_b0.location = __x->location;
        if (!bVar5) {
          if (local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged == false) {
            local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged = true;
          }
          local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
        }
        SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                  ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&local_b0);
        std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(&local_b0.notes)
        ;
        if (local_b0.ranges.
            super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0.ranges.
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b0.ranges.
                                super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b0.ranges.
                                super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::~vector(&local_b0.args);
        while (__x_00 = __x + 1,
              __x_00 != (ppVar14->second).
                        super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::vector(&local_b0.args,&__x_00->args);
          std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
                    (&local_b0.ranges,&__x[1].ranges);
          std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
                    (&local_b0.notes,&__x[1].notes);
          local_b0.symbol = __x[1].symbol;
          local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload =
               __x[1].coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged =
               __x[1].coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
          local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._9_7_ =
               *(undefined7 *)
                &__x[1].coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>.field_0x9;
          local_b0.code = __x[1].code;
          local_b0._92_4_ = *(undefined4 *)&__x[1].field_0x5c;
          local_b0.location = __x[1].location;
          bVar6 = Diagnostic::operator==
                            (&local_b0,
                             (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                             super_SmallVectorBase<slang::Diagnostic>.data_ +
                             ((__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                              super_SmallVectorBase<slang::Diagnostic>.len - 1));
          if (!bVar6) {
            if (!bVar5) {
              if (local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged == false) {
                local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged = true;
              }
              local_b0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
            }
            SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                      ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&local_b0);
          }
          std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector
                    (&local_b0.notes);
          if (local_b0.ranges.
              super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.ranges.
                            super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.ranges.
                                  super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.ranges.
                                  super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::~vector(&local_b0.args);
          __x = __x_00;
        }
      }
LAB_0044db5a:
      puVar10 = local_b8 + 0x12;
      puVar12 = local_b8 + 2;
      while( true ) {
        puVar9 = puVar12;
        puVar12 = iVar17.pc_;
        ppVar14 = iVar17.p_ + 1;
        if (((uint)iVar17.pc_ & 0xf) == 0xe) break;
        iVar17.p_ = ppVar14;
        iVar17.pc_ = puVar12 + 1;
        puVar10 = puVar10 + 1;
        puVar12 = puVar9 + 1;
        if (puVar9[-1] != '\0') goto code_r0x0044db8d;
      }
      auVar15[0] = -(*puVar9 == '\0');
      auVar15[1] = -(puVar9[1] == '\0');
      auVar15[2] = -(puVar9[2] == '\0');
      auVar15[3] = -(puVar9[3] == '\0');
      auVar15[4] = -(puVar9[4] == '\0');
      auVar15[5] = -(puVar9[5] == '\0');
      auVar15[6] = -(puVar9[6] == '\0');
      auVar15[7] = -(puVar9[7] == '\0');
      auVar15[8] = -(puVar9[8] == '\0');
      auVar15[9] = -(puVar9[9] == '\0');
      auVar15[10] = -(puVar9[10] == '\0');
      auVar15[0xb] = -(puVar9[0xb] == '\0');
      auVar15[0xc] = -(puVar9[0xc] == '\0');
      auVar15[0xd] = -(puVar9[0xd] == '\0');
      auVar15[0xe] = -(puVar9[0xe] == '\0');
      auVar15[0xf] = -(puVar9[0xf] == '\0');
      uVar3 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
      while (uVar3 == 0x7fff) {
        ppVar14 = ppVar14 + 0xf;
        auVar16[0] = -(*puVar10 == '\0');
        auVar16[1] = -(puVar10[1] == '\0');
        auVar16[2] = -(puVar10[2] == '\0');
        auVar16[3] = -(puVar10[3] == '\0');
        auVar16[4] = -(puVar10[4] == '\0');
        auVar16[5] = -(puVar10[5] == '\0');
        auVar16[6] = -(puVar10[6] == '\0');
        auVar16[7] = -(puVar10[7] == '\0');
        auVar16[8] = -(puVar10[8] == '\0');
        auVar16[9] = -(puVar10[9] == '\0');
        auVar16[10] = -(puVar10[10] == '\0');
        auVar16[0xb] = -(puVar10[0xb] == '\0');
        auVar16[0xc] = -(puVar10[0xc] == '\0');
        auVar16[0xd] = -(puVar10[0xd] == '\0');
        auVar16[0xe] = -(puVar10[0xe] == '\0');
        auVar16[0xf] = -(puVar10[0xf] == '\0');
        puVar9 = puVar10;
        puVar10 = puVar10 + 0x10;
        uVar3 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
      }
      uVar2 = 0;
      if ((uVar3 ^ 0x7fff) != 0) {
        for (; ((uVar3 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (puVar9[uVar2] == '\x01') break;
      iVar17.p_ = ppVar14 + uVar2;
      iVar17.pc_ = puVar9 + uVar2;
    } while( true );
  }
LAB_0044dd95:
  if (local_38 != (SourceManager *)0x0) {
    Diagnostics::sort(__return_storage_ptr__,local_38);
  }
  return __return_storage_ptr__;
code_r0x0044db8d:
  if (puVar9[-1] != '\x01') {
    iVar17.pc_ = puVar9 + -1;
    goto LAB_0044d96e;
  }
  goto LAB_0044dd95;
}

Assistant:

Diagnostics ASTDiagMap::coalesce(const SourceManager* sourceManager) {
    Diagnostics results;
    for (auto& [key, diagList] : map) {
        // If the location is NoLocation, just issue each diagnostic.
        if (std::get<1>(key) == SourceLocation::NoLocation) {
            for (auto& diag : diagList)
                results.emplace_back(diag);
            continue;
        }

        // Try to find a diagnostic in an instance that isn't at the top-level
        // (printing such a path seems silly).
        const Diagnostic* found = nullptr;
        const Symbol* inst = nullptr;
        size_t count = 0;
        bool differingArgs = false;

        for (auto& diag : diagList) {
            if (found && *found != diag) {
                differingArgs = true;
                break;
            }

            auto symbol = diag.symbol;
            while (symbol && symbol->kind != SymbolKind::InstanceBody) {
                const Scope* scope;
                if (symbol->kind == SymbolKind::CheckerInstanceBody) {
                    auto& checkerBody = symbol->as<CheckerInstanceBodySymbol>();
                    SLANG_ASSERT(checkerBody.parentInstance);
                    scope = checkerBody.parentInstance->getParentScope();

                    // Add an expansion note to the diagnostic since
                    // we won't have added it yet for the checker.
                    if (!checkerBody.flags.has(InstanceFlags::Uninstantiated)) {
                        diag.addNote(diag::NoteWhileExpanding, checkerBody.parentInstance->location)
                            << "checker"sv << checkerBody.checker.name;
                    }
                }
                else {
                    scope = symbol->getParentScope();
                }

                symbol = scope ? &scope->asSymbol() : nullptr;
            }

            if (!symbol)
                continue;

            auto parent = symbol->as<InstanceBodySymbol>().parentInstance;
            SLANG_ASSERT(parent);

            count++;
            if (auto scope = parent->getParentScope()) {
                auto& sym = scope->asSymbol();
                if (sym.kind != SymbolKind::Root && sym.kind != SymbolKind::CompilationUnit) {
                    found = &diag;
                    inst = parent;
                }
            }
        }

        if (!differingArgs && found &&
            inst->as<InstanceSymbol>().getDefinition().getInstanceCount() > count) {
            // The diagnostic is present only in some instances, so include the coalescing
            // information to point the user towards the right ones.
            Diagnostic diag = *found;
            diag.symbol = inst;
            diag.coalesceCount = count;
            results.emplace_back(std::move(diag));
        }
        else {
            // Otherwise no coalescing. If we had differing arguments then set each
            // diagnostic's coalesce count to 1 (as opposed to letting it stay nullopt)
            // so that we get the instance path to it printed automatically.
            auto it = diagList.begin();
            SLANG_ASSERT(it != diagList.end());

            {
                Diagnostic d = *it;
                if (differingArgs)
                    d.coalesceCount = 1;
                results.emplace_back(std::move(d));
            }

            for (++it; it != diagList.end(); ++it) {
                Diagnostic d = *it;
                if (d != results.back()) {
                    if (differingArgs)
                        d.coalesceCount = 1;
                    results.emplace_back(std::move(d));
                }
            }
        }
    }

    if (sourceManager)
        results.sort(*sourceManager);

    return results;
}